

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void gai_scatter_acc_local
               (Integer g_a,void *v,Integer *i,Integer *j,Integer nv,void *alpha,Integer proc)

{
  long lVar1;
  global_array_t *pgVar2;
  void **ppvVar3;
  short sVar4;
  uint uVar5;
  C_Integer *pCVar6;
  Integer IVar7;
  char *pcVar8;
  void *scale;
  int _i;
  int iVar9;
  Integer IVar10;
  void **__ptr;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  C_Integer CVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  void *pvVar20;
  C_Integer CVar21;
  long lVar22;
  Integer _lo [2];
  C_Integer local_1e0;
  Integer _hi [2];
  Integer ldp;
  char *ptr_ref;
  long local_178;
  void *local_170;
  long local_168;
  void *local_160;
  Integer hi [2];
  Integer lo [2];
  armci_giov_t desc;
  
  if (nv < 1) {
    return;
  }
  lVar1 = g_a + 1000;
  local_168 = (long)GA[lVar1].p_handle;
  local_170 = v;
  local_160 = alpha;
  pnga_distribution(g_a,proc,lo,hi);
  if (GA[lVar1].distr_type != 0) {
    pnga_access_block_ptr(g_a,proc,&ptr_ref,&ldp);
    iVar9 = GA[lVar1].distr_type;
    if (iVar9 - 3U < 2) {
      sVar4 = GA[lVar1].ndim;
      uVar18 = (uint)sVar4;
      lVar13 = (long)(int)proc % GA[lVar1].num_blocks[0];
      lVar14 = lVar13;
      lVar12 = 0;
      while (lVar12 + 1 < (long)(int)uVar18) {
        proc = ((int)proc - lVar14) / GA[g_a + 1000].num_blocks[lVar12];
        lVar14 = (long)(int)proc % GA[g_a + 1000].num_blocks[lVar12 + 1];
        _lo[lVar12 + 1] = lVar14;
        lVar12 = lVar12 + 1;
      }
      _lo[0] = lVar13 % (long)GA[lVar1].nblock[0];
      _lo[1] = _lo[1] % (long)GA[lVar1].nblock[1];
      uVar11 = 0;
      uVar19 = 0;
      if (0 < sVar4) {
        uVar19 = (ulong)uVar18;
      }
      for (; uVar19 != uVar11; uVar11 = uVar11 + 1) {
        (&desc.src_ptr_array)[uVar11] = (void **)(_lo[uVar11] % (long)GA[g_a + 1000].nblock[uVar11])
        ;
      }
      proc = lo[(long)(int)uVar18 + 1];
      for (uVar18 = uVar18 - 2; -1 < (int)uVar18; uVar18 = uVar18 - 1) {
        proc = proc * GA[lVar1].nblock[uVar18] + (long)(&desc.src_ptr_array)[uVar18];
      }
    }
    else if (iVar9 == 1) {
      IVar10 = pnga_nnodes();
      proc = proc % IVar10;
    }
    else if (iVar9 == 2) {
      sVar4 = GA[lVar1].ndim;
      uVar18 = (uint)sVar4;
      lVar13 = (long)(int)proc % GA[lVar1].num_blocks[0];
      lVar14 = lVar13;
      lVar12 = 0;
      while (lVar12 + 1 < (long)(int)uVar18) {
        proc = ((int)proc - lVar14) / GA[g_a + 1000].num_blocks[lVar12];
        lVar14 = (long)(int)proc % GA[g_a + 1000].num_blocks[lVar12 + 1];
        _lo[lVar12 + 1] = lVar14;
        lVar12 = lVar12 + 1;
      }
      _lo[0] = lVar13 % (long)GA[lVar1].nblock[0];
      _lo[1] = _lo[1] % (long)GA[lVar1].nblock[1];
      uVar11 = 0;
      uVar19 = 0;
      if (0 < sVar4) {
        uVar19 = (ulong)uVar18;
      }
      for (; uVar19 != uVar11; uVar11 = uVar11 + 1) {
        (&desc.src_ptr_array)[uVar11] = (void **)(_lo[uVar11] % (long)GA[g_a + 1000].nblock[uVar11])
        ;
      }
      proc = lo[(long)(int)uVar18 + 1];
      for (uVar18 = uVar18 - 2; -1 < (int)uVar18; uVar18 = uVar18 - 1) {
        proc = proc * GA[lVar1].nblock[uVar18] + (long)(&desc.src_ptr_array)[uVar18];
      }
    }
    goto LAB_00173dc7;
  }
  pgVar2 = GA + lVar1;
  lVar14 = pgVar2->num_rstrctd;
  if (lVar14 < 1) {
    CVar21 = pgVar2->width[0];
    local_1e0 = pgVar2->width[1];
    lVar12 = proc;
    if (lVar14 != 0) goto LAB_00173a36;
    uVar18._0_2_ = pgVar2->ndim;
    uVar18._2_2_ = pgVar2->irreg;
    uVar19 = 0;
    uVar11 = (ulong)uVar18;
    if ((short)(undefined2)uVar18 < 1) {
      uVar11 = uVar19;
    }
    lVar13 = 1;
    uVar11 = uVar11 & 0xffff;
    for (; uVar11 != uVar19; uVar19 = uVar19 + 1) {
      lVar13 = lVar13 * GA[g_a + 1000].nblock[uVar19];
    }
    if ((proc < 0) || (lVar13 <= proc)) {
      for (uVar19 = 0; uVar11 != uVar19; uVar19 = uVar19 + 1) {
        _lo[uVar19] = 0;
        _hi[uVar19] = -1;
      }
    }
    else {
      lVar13 = 0;
      IVar10 = proc;
      for (uVar19 = 0; uVar11 != uVar19; uVar19 = uVar19 + 1) {
        lVar15 = (long)GA[g_a + 1000].nblock[uVar19];
        lVar17 = IVar10 % lVar15;
        pCVar6 = pgVar2->mapc;
        _lo[uVar19] = pCVar6[lVar17 + lVar13];
        if (lVar17 == lVar15 + -1) {
          CVar16 = GA[g_a + 1000].dims[uVar19];
        }
        else {
          CVar16 = pCVar6[lVar17 + lVar13 + 1] + -1;
        }
        lVar13 = lVar13 + lVar15;
        _hi[uVar19] = CVar16;
        IVar10 = IVar10 / lVar15;
      }
    }
  }
  else {
    CVar21 = pgVar2->width[0];
    local_1e0 = pgVar2->width[1];
    lVar12 = pgVar2->rank_rstrctd[proc];
LAB_00173a36:
    uVar5._0_2_ = pgVar2->ndim;
    uVar5._2_2_ = pgVar2->irreg;
    uVar18 = 0;
    if (0 < (short)(undefined2)uVar5) {
      uVar18 = uVar5;
    }
    uVar11 = (ulong)(uVar18 & 0xffff);
    if (lVar12 < lVar14) {
      lVar13 = 1;
      for (uVar19 = 0; uVar11 != uVar19; uVar19 = uVar19 + 1) {
        lVar13 = lVar13 * GA[g_a + 1000].nblock[uVar19];
      }
      if ((lVar12 < 0) || (lVar13 <= lVar12)) {
        for (uVar19 = 0; uVar11 != uVar19; uVar19 = uVar19 + 1) {
          _lo[uVar19] = 0;
          _hi[uVar19] = -1;
        }
      }
      else {
        lVar17 = 0;
        lVar13 = lVar12;
        for (uVar19 = 0; uVar11 != uVar19; uVar19 = uVar19 + 1) {
          lVar22 = (long)GA[g_a + 1000].nblock[uVar19];
          lVar15 = lVar13 % lVar22;
          pCVar6 = pgVar2->mapc;
          _lo[uVar19] = pCVar6[lVar15 + lVar17];
          if (lVar15 == lVar22 + -1) {
            CVar16 = GA[g_a + 1000].dims[uVar19];
          }
          else {
            CVar16 = pCVar6[lVar15 + lVar17 + 1] + -1;
          }
          lVar17 = lVar17 + lVar22;
          _hi[uVar19] = CVar16;
          lVar13 = lVar13 / lVar22;
        }
      }
    }
    else {
      for (uVar19 = 0; uVar11 != uVar19; uVar19 = uVar19 + 1) {
        _lo[uVar19] = 0;
        _hi[uVar19] = -1;
      }
    }
  }
  IVar7 = _lo[1];
  IVar10 = _lo[0];
  if (pgVar2->p_handle == 0) {
    CVar16 = (C_Integer)PGRP_LIST->inv_map_proc_list[lVar12];
  }
  else {
    CVar16 = lVar12;
    if (lVar14 != 0) {
      CVar16 = pgVar2->rstrctd_list[lVar12];
    }
  }
  if ((_hi[1] < lo[1] || _hi[0] < lo[0]) || (lo[1] < _lo[1] || lo[0] < _lo[0])) {
    sprintf((char *)&desc,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation",
            lVar12,lo[0],lo[1],_lo[0],_hi[0],_lo[1],_hi[1]);
    pnga_error((char *)&desc,g_a);
  }
  ldp = ((CVar21 * 2 + 1) - IVar10) + _hi[0];
  ptr_ref = GA[lVar1].ptr[CVar16] +
            (((CVar21 + lo[0]) - IVar10) + ((local_1e0 + lo[1]) - IVar7) * ldp) *
            *(long *)(BYTE_ARRAY_001d1289 + (long)GA[lVar1].type * 0x10 + 399);
LAB_00173dc7:
  local_178 = (long)GA[lVar1].type;
  lVar1 = *(long *)(BYTE_ARRAY_001d1289 + local_178 * 0x10 + 399);
  iVar9 = (int)nv;
  __ptr = (void **)malloc((long)(iVar9 * 2) << 3);
  if (__ptr == (void **)0x0) {
    pnga_error("malloc failed",nv);
  }
  pcVar8 = ptr_ref;
  IVar10 = ldp;
  ppvVar3 = __ptr + nv;
  pvVar20 = local_170;
  for (lVar14 = 0; scale = local_160, nv != lVar14; lVar14 = lVar14 + 1) {
    lVar12 = i[lVar14];
    lVar13 = j[lVar14];
    if ((hi[0] < lVar12 || lVar12 < lo[0]) || (hi[1] < lVar13 || lVar13 < lo[1])) {
      sprintf((char *)&desc,"proc=%d invalid i/j=(%ld,%ld)>< [%ld:%ld,%ld:%ld]",proc);
      pnga_error((char *)&desc,g_a);
      lVar13 = j[lVar14];
      lVar12 = i[lVar14];
    }
    ppvVar3[lVar14] = pcVar8 + ((lVar12 - lo[0]) + (lVar13 - lo[1]) * IVar10) * lVar1;
    __ptr[lVar14] = pvVar20;
    pvVar20 = (void *)((long)pvVar20 + lVar1);
  }
  desc.bytes = (int)lVar1;
  if (GA_fence_set != 0) {
    fence_array[proc] = '\x01';
  }
  if (-1 < (int)local_168) {
    proc = (Integer)(uint)PGRP_LIST[local_168].inv_map_proc_list[proc];
  }
  desc.src_ptr_array = __ptr;
  desc.dst_ptr_array = ppvVar3;
  desc.ptr_array_len = iVar9;
  if (local_160 != (void *)0x0) {
    uVar18 = (int)local_178 - 0x3e9;
    if ((uVar18 < 7) && ((0x6fU >> (uVar18 & 0x1f) & 1) != 0)) {
      iVar9 = *(int *)(&DAT_001b5bd8 + (ulong)uVar18 * 4);
    }
    else {
      pnga_error("type not supported",local_178);
      iVar9 = -1;
    }
    iVar9 = ARMCI_AccV(iVar9,scale,&desc,1,(int)proc);
    if (iVar9 != 0) {
      pnga_error("scatter/_acc failed in armci",(long)iVar9);
    }
  }
  free(__ptr);
  return;
}

Assistant:

void gai_scatter_acc_local(Integer g_a, void *v,Integer *i,Integer *j,
                          Integer nv, void* alpha, Integer proc) 
{
void **ptr_src, **ptr_dst;
char *ptr_ref;
Integer ldp, item_size, ilo, ihi, jlo, jhi, type;
Integer lo[2], hi[2];
Integer handle,p_handle,iproc;
armci_giov_t desc;
register Integer k, offset;
int rc=0;

  if (nv < 1) return;

  
  handle = GA_OFFSET + g_a;
  p_handle = GA[handle].p_handle;

  pnga_distribution(g_a, proc, lo, hi);
  ilo = lo[0];
  jlo = lo[1];
  ihi = hi[0];
  jhi = hi[1];

  iproc = proc;
  if (GA[handle].distr_type == REGULAR) {
    if (GA[handle].num_rstrctd > 0)
      iproc = GA[handle].rank_rstrctd[iproc];
    gaShmemLocation(iproc, g_a, ilo, jlo, &ptr_ref, &ldp);
  } else {
    /*
    Integer lo[2];
    lo[0] = ilo;
    lo[1] = jlo;
    */
    pnga_access_block_ptr(g_a, iproc, &ptr_ref, &ldp);
    pnga_release_block(g_a, iproc);
    if (GA[handle].distr_type == BLOCK_CYCLIC) {
      proc = proc%pnga_nnodes();
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[2];
      gam_find_block_indices(handle, proc, index);
      index[0] = index[0]%GA[handle].nblock[0];
      index[1] = index[1]%GA[handle].nblock[1];
      gam_find_proc_from_sl_indices(handle,proc,index);
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[2];
      gam_find_block_indices(handle, proc, index);
      index[0] = index[0]%GA[handle].nblock[0];
      index[1] = index[1]%GA[handle].nblock[1];
      gam_find_tile_proc_from_indices(handle,proc,index);
    }

  }

  type = GA[handle].type;
  item_size = GAsizeofM(type);

  ptr_src = malloc((int)nv*2*sizeof(void*));
  if(ptr_src==NULL)pnga_error("malloc failed",nv);
  ptr_dst=ptr_src+ nv;

  for(k=0; k< nv; k++){
     if(i[k] < ilo || i[k] > ihi  || j[k] < jlo || j[k] > jhi){
       char err_string[ERR_STR_LEN];
       sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)>< [%ld:%ld,%ld:%ld]",
               (int)proc, (long)i[k], (long)j[k], (long)ilo, 
               (long)ihi, (long)jlo, (long)jhi); 
       pnga_error(err_string,g_a);
     }

     offset  = (j[k] - jlo)* ldp + i[k] - ilo;
     ptr_dst[k] = ptr_ref + item_size * offset;
     ptr_src[k] = ((char*)v) + k*item_size;
  }
  desc.bytes = (int)item_size;
  desc.src_ptr_array = ptr_src;
  desc.dst_ptr_array = ptr_dst;
  desc.ptr_array_len = (int)nv;

  if(GA_fence_set)fence_array[proc]=1;

  if (p_handle >= 0) {
    proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
  }
  if(alpha != NULL) {
    int optype=-1;
    if(type==C_DBL) optype= ARMCI_ACC_DBL;
    else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
    else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
    else if(type==C_INT)optype= ARMCI_ACC_INT;
    else if(type==C_LONG)optype= ARMCI_ACC_LNG;
    else if(type==C_FLOAT)optype= ARMCI_ACC_FLT;  
    else pnga_error("type not supported",type);
    rc= ARMCI_AccV(optype, alpha, &desc, 1, (int)proc);
  }

  if(rc) pnga_error("scatter/_acc failed in armci",rc);

  free(ptr_src);

}